

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.cpp
# Opt level: O0

SampledSpectrum __thiscall
pbrt::SurfaceInteraction::Le(SurfaceInteraction *this,Vector3f *w,SampledWavelengths *lambda)

{
  array<float,_4> aVar1;
  bool bVar2;
  Interaction *in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar6 [64];
  Point3f PVar8;
  SampledSpectrum SVar9;
  SampledWavelengths *in_stack_00000028;
  Point3f *in_stack_00000048;
  LightHandle *in_stack_00000050;
  undefined8 in_stack_ffffffffffffffa8;
  Float c;
  undefined8 local_10;
  undefined8 local_8;
  undefined1 auVar5 [56];
  undefined1 auVar7 [56];
  
  c = (Float)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  auVar7 = in_ZMM1._8_56_;
  auVar5 = in_ZMM0._8_56_;
  bVar2 = pbrt::TaggedPointer::operator_cast_to_bool((TaggedPointer *)&in_RDI[2].n);
  if (bVar2) {
    PVar8 = Interaction::p(in_RDI);
    auVar3._0_8_ = PVar8.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar3._8_56_ = auVar5;
    vmovlpd_avx(auVar3._0_16_);
    SVar9 = LightHandle::L(in_stack_00000050,in_stack_00000048,(Normal3f *)this,(Point2f *)w,
                           (Vector3f *)lambda,in_stack_00000028);
    auVar6._0_8_ = SVar9.values.values._8_8_;
    auVar6._8_56_ = auVar7;
    auVar4._0_8_ = SVar9.values.values._0_8_;
    auVar4._8_56_ = auVar5;
    local_10 = vmovlpd_avx(auVar4._0_16_);
    local_8 = vmovlpd_avx(auVar6._0_16_);
  }
  else {
    SampledSpectrum::SampledSpectrum((SampledSpectrum *)in_RDI,c);
  }
  aVar1.values[2] = (float)(undefined4)local_8;
  aVar1.values[3] = (float)local_8._4_4_;
  aVar1.values[0] = (float)(undefined4)local_10;
  aVar1.values[1] = (float)local_10._4_4_;
  return (array<float,_4>)(array<float,_4>)aVar1.values;
}

Assistant:

SampledSpectrum SurfaceInteraction::Le(const Vector3f &w,
                                       const SampledWavelengths &lambda) const {
    return areaLight ? areaLight.L(p(), n, uv, w, lambda) : SampledSpectrum(0.f);
}